

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_round(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
               lyxp_set *set,int options)

{
  longdouble lVar1;
  lyxp_set *set_00;
  int iVar2;
  int iVar3;
  lys_node *plVar4;
  char *pcVar5;
  char *format;
  ly_ctx *ctx;
  longdouble lVar6;
  
  set_00 = *args;
  if ((options & 0x1cU) == 0) {
    iVar3 = lyxp_set_cast(set_00,LYXP_SET_NUMBER,cur_node,param_4,options);
    if (iVar3 != 0) {
      return -1;
    }
    lVar1 = ((*args)->val).num;
    lVar6 = (longdouble)0;
    if (((lVar1 == lVar6) && (!NAN(lVar1) && !NAN(lVar6))) ||
       ((longdouble)-0.5 <= lVar1 && lVar1 < lVar6)) {
      lVar6 = -lVar6;
    }
    else {
      ((*args)->val).num = lVar1 + (longdouble)0.5;
      iVar3 = xpath_floor(args,0,cur_node,param_4,*args,options);
      if (iVar3 != 0) {
        return -1;
      }
      lVar6 = ((*args)->val).num;
    }
    set_fill_number(set,lVar6);
    return 0;
  }
  if ((set_00->type == LYXP_SET_SNODE_SET) &&
     (plVar4 = warn_get_snode_in_ctx(set_00), plVar4 != (lys_node *)0x0)) {
    if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      ctx = param_4->ctx;
      pcVar5 = strnodetype(plVar4->nodetype);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar2 = warn_is_specific_type((lys_type *)&plVar4[1].ref,LY_TYPE_DEC64);
      iVar3 = 0;
      if (iVar2 != 0) goto LAB_0017799f;
      ctx = param_4->ctx;
      pcVar5 = plVar4->name;
      format = "Argument #1 of %s is node \"%s\", not of type \"decimal64\".";
    }
    iVar3 = 1;
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_round",pcVar5);
  }
  else {
    iVar3 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_round");
  }
LAB_0017799f:
  set_snode_clear_ctx(set);
  return iVar3;
}

Assistant:

static int
xpath_round(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
            struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_DEC64)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"decimal64\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }

    /* cover only the cases where floor can't be used */
    if ((args[0]->val.num == -0.0f) || ((args[0]->val.num < 0) && (args[0]->val.num >= -0.5))) {
        set_fill_number(set, -0.0f);
    } else {
        args[0]->val.num += 0.5;
        if (xpath_floor(args, 1, cur_node, local_mod, args[0], options)) {
            return -1;
        }
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}